

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetFrameworkVersion_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  allocator<char> local_82;
  allocator<char> local_81;
  string local_80;
  cmValue local_60;
  cmValue tversion;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue fversion;
  cmGeneratorTarget *this_local;
  
  fversion.Value = (string *)this;
  TVar2 = GetType(this);
  if (TVar2 != INTERFACE_LIBRARY) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"FRAMEWORK_VERSION",&local_41);
    local_20 = GetProperty(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    bVar1 = cmValue::operator_cast_to_bool(&local_20);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_20);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"VERSION",&local_81);
      local_60 = GetProperty(this,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator(&local_81);
      bVar1 = cmValue::operator_cast_to_bool(&local_60);
      if (bVar1) {
        psVar3 = cmValue::operator*[abi_cxx11_(&local_60);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"A",&local_82);
        std::allocator<char>::~allocator(&local_82);
      }
    }
    return __return_storage_ptr__;
  }
  __assert_fail("this->GetType() != cmStateEnums::INTERFACE_LIBRARY",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorTarget.cxx"
                ,0x19fa,"std::string cmGeneratorTarget::GetFrameworkVersion() const");
}

Assistant:

std::string cmGeneratorTarget::GetFrameworkVersion() const
{
  assert(this->GetType() != cmStateEnums::INTERFACE_LIBRARY);

  if (cmValue fversion = this->GetProperty("FRAMEWORK_VERSION")) {
    return *fversion;
  }
  if (cmValue tversion = this->GetProperty("VERSION")) {
    return *tversion;
  }
  return "A";
}